

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS ref_search_stats(REF_SEARCH ref_search)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = ref_search->n;
  uVar2 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  uVar4 = 0;
  uVar6 = 0;
  uVar5 = 0;
  uVar3 = 0;
  do {
    if (uVar7 == uVar2) {
      printf("n %d empty %d zero %d one %d two %d\n",(ulong)uVar1,uVar4,uVar3,uVar5,uVar6);
      return 0;
    }
    if (ref_search->item[uVar2] == -1) {
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    else if (ref_search->left[uVar2] == -1) {
      if (ref_search->right[uVar2] != -1) goto LAB_00191ee1;
      uVar3 = (ulong)((int)uVar3 + 1);
    }
    else if (ref_search->right[uVar2] == -1) {
LAB_00191ee1:
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    else {
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_search_stats(REF_SEARCH ref_search) {
  REF_INT i, empty, two, one, zero;
  empty = 0;
  two = 0;
  one = 0;
  zero = 0;
  for (i = 0; i < ref_search->n; i++) {
    if (REF_EMPTY == ref_search->item[i]) {
      empty += 1;
      continue;
    }
    if (REF_EMPTY == ref_search->left[i] && REF_EMPTY == ref_search->right[i]) {
      zero += 1;
      continue;
    }
    if (REF_EMPTY != ref_search->left[i] && REF_EMPTY != ref_search->right[i]) {
      two += 1;
      continue;
    }
    one += 1;
  }
  printf("n %d empty %d zero %d one %d two %d\n", ref_search->n, empty, zero,
         one, two);

  return REF_SUCCESS;
}